

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O0

void __thiscall Reader::processsossec(Reader *this)

{
  bool bVar1;
  short sVar2;
  size_type sVar3;
  mapped_type *this_00;
  pointer pPVar4;
  element_type *peVar5;
  __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
  *p_Var6;
  double weight;
  shared_ptr<Variable> var;
  iterator next;
  string name;
  shared_ptr<SOS> sos;
  iterator *end;
  iterator *begin;
  LpSectionKeyword this_section_keyword;
  SOS *in_stack_ffffffffffffff18;
  vector<std::pair<std::shared_ptr<Variable>,_double>,_std::allocator<std::pair<std::shared_ptr<Variable>,_double>_>_>
  *in_stack_ffffffffffffff20;
  value_type *in_stack_ffffffffffffff28;
  pair<std::shared_ptr<Variable>,_double> *in_stack_ffffffffffffff30;
  SOS *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  int iVar7;
  map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
  *in_stack_ffffffffffffff60;
  __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
  local_70;
  undefined1 local_61 [49];
  string *in_stack_ffffffffffffffd0;
  Builder *in_stack_ffffffffffffffd8;
  
  sVar3 = std::
          map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
          ::count((map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
                   *)in_stack_ffffffffffffff30,(key_type *)in_stack_ffffffffffffff28);
  if (sVar3 != 0) {
    this_00 = std::
              map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
              ::operator[](in_stack_ffffffffffffff60,
                           (key_type *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
                          );
    std::
    map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
    ::operator[](in_stack_ffffffffffffff60,
                 (key_type *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                               *)in_stack_ffffffffffffff20,
                              (__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                               *)in_stack_ffffffffffffff18), bVar1) {
      operator_new(0x40);
      SOS::SOS(in_stack_ffffffffffffff40);
      std::shared_ptr<SOS>::shared_ptr<SOS,void>
                ((shared_ptr<SOS> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      __gnu_cxx::
      __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
      ::operator->(&this_00->first);
      lpassert(SUB81((ulong)in_stack_ffffffffffffff30 >> 0x38,0));
      pPVar4 = __gnu_cxx::
               __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
               ::operator->(&this_00->first);
      in_stack_ffffffffffffff40 = (SOS *)(pPVar4->field_1).name;
      peVar5 = std::__shared_ptr_access<SOS,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<SOS,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          0x4201aa);
      std::__cxx11::string::operator=((string *)peVar5,(char *)in_stack_ffffffffffffff40);
      __gnu_cxx::
      __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
      ::operator++(&this_00->first);
      __gnu_cxx::operator!=
                ((__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                  *)in_stack_ffffffffffffff20,
                 (__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                  *)in_stack_ffffffffffffff18);
      lpassert(SUB81((ulong)in_stack_ffffffffffffff30 >> 0x38,0));
      __gnu_cxx::
      __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
      ::operator->(&this_00->first);
      lpassert(SUB81((ulong)in_stack_ffffffffffffff30 >> 0x38,0));
      pPVar4 = __gnu_cxx::
               __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
               ::operator->(&this_00->first);
      sVar2 = 2;
      if ((pPVar4->field_1).keyword == NONE) {
        sVar2 = 1;
      }
      peVar5 = std::__shared_ptr_access<SOS,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<SOS,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          0x420236);
      peVar5->type = sVar2;
      __gnu_cxx::
      __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
      ::operator++(&this_00->first);
      do {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                            *)in_stack_ffffffffffffff20,
                           (__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                            *)in_stack_ffffffffffffff18);
        if ((!bVar1) ||
           (pPVar4 = __gnu_cxx::
                     __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                     ::operator->(&this_00->first), pPVar4->type != CONID)) break;
        pPVar4 = __gnu_cxx::
                 __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                 ::operator->(&this_00->first);
        in_stack_ffffffffffffff28 = (value_type *)(pPVar4->field_1).name;
        in_stack_ffffffffffffff30 = (pair<std::shared_ptr<Variable>,_double> *)local_61;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_61 + 1),(char *)in_stack_ffffffffffffff28,
                   (allocator *)in_stack_ffffffffffffff30);
        std::allocator<char>::~allocator((allocator<char> *)local_61);
        local_70._M_current = (this_00->first)._M_current;
        __gnu_cxx::
        __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
        ::operator++(&local_70);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                            *)in_stack_ffffffffffffff20,
                           (__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                            *)in_stack_ffffffffffffff18);
        if ((bVar1) &&
           (pPVar4 = __gnu_cxx::
                     __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                     ::operator->(&local_70), pPVar4->type == CONST)) {
          Builder::getvarbyname(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
          __gnu_cxx::
          __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
          ::operator->(&local_70);
          peVar5 = std::__shared_ptr_access<SOS,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<SOS,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                              0x420395);
          in_stack_ffffffffffffff20 = &peVar5->entries;
          std::pair<std::shared_ptr<Variable>,_double>::
          pair<std::shared_ptr<Variable>_&,_double_&,_true>
                    (in_stack_ffffffffffffff30,(shared_ptr<Variable> *)in_stack_ffffffffffffff28,
                     (double *)in_stack_ffffffffffffff20);
          std::
          vector<std::pair<std::shared_ptr<Variable>,_double>,_std::allocator<std::pair<std::shared_ptr<Variable>,_double>_>_>
          ::push_back(in_stack_ffffffffffffff20,(value_type *)in_stack_ffffffffffffff18);
          std::pair<std::shared_ptr<Variable>,_double>::~pair
                    ((pair<std::shared_ptr<Variable>,_double> *)0x4203cf);
          p_Var6 = __gnu_cxx::
                   __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                   ::operator++(&local_70);
          (this_00->first)._M_current = p_Var6->_M_current;
          iVar7 = 4;
          std::shared_ptr<Variable>::~shared_ptr((shared_ptr<Variable> *)0x4203fc);
        }
        else {
          iVar7 = 5;
        }
        std::__cxx11::string::~string((string *)(local_61 + 1));
      } while (iVar7 == 4);
      std::vector<std::shared_ptr<SOS>,_std::allocator<std::shared_ptr<SOS>_>_>::push_back
                ((vector<std::shared_ptr<SOS>,_std::allocator<std::shared_ptr<SOS>_>_> *)
                 in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      std::shared_ptr<SOS>::~shared_ptr((shared_ptr<SOS> *)0x4204da);
    }
  }
  return;
}

Assistant:

void Reader::processsossec() {
  const LpSectionKeyword this_section_keyword = LpSectionKeyword::SOS;
  if (!sectiontokens.count(this_section_keyword)) return;
  std::vector<ProcessedToken>::iterator& begin(
      sectiontokens[this_section_keyword].first);
  std::vector<ProcessedToken>::iterator& end(
      sectiontokens[this_section_keyword].second);
  while (begin != end) {
    std::shared_ptr<SOS> sos = std::shared_ptr<SOS>(new SOS);

    // sos1: S1 :: x1 : 1  x2 : 2  x3 : 3

    // name of SOS is mandatory
    lpassert(begin->type == ProcessedTokenType::CONID);
    sos->name = begin->name;
    ++begin;

    // SOS type
    lpassert(begin != end);
    lpassert(begin->type == ProcessedTokenType::SOSTYPE);
    sos->type = begin->sostype == SosType::SOS1 ? 1 : 2;
    ++begin;

    while (begin != end) {
      // process all "var : weight" entries
      // when processtokens() sees a string followed by a colon, it classifies
      // this as a CONID but in a SOS section, this is actually a variable
      // identifier
      if (begin->type != ProcessedTokenType::CONID) break;
      std::string name = begin->name;
      std::vector<ProcessedToken>::iterator next = begin;
      ++next;
      if (next != end && next->type == ProcessedTokenType::CONST) {
        auto var = builder.getvarbyname(name);
        double weight = next->value;

        sos->entries.push_back({var, weight});

        begin = ++next;
        continue;
      }

      break;
    }

    builder.model.soss.push_back(sos);
  }
}